

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

MessageSizeCounts
capnp::_::WireHelpers::totalSize(SegmentReader *segment,WirePointer *ref,int nestingLimit)

{
  WirePointer *pWVar1;
  ushort uVar2;
  word *pwVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  SegmentReader *pSVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  WirePointer *pWVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  WirePointer *pWVar17;
  MessageSizeCounts MVar18;
  Iterator __end7;
  Fault f;
  Fault local_38;
  undefined4 extraout_var_00;
  
  uVar6 = (ref->offsetAndKind).value;
  if ((ref->field_1).upper32Bits != 0 || uVar6 != 0) {
    if (nestingLimit < 1) {
      totalSize();
    }
    else {
      pWVar11 = ref + 1;
      lVar10 = (long)((int)uVar6 >> 2);
      if (segment == (SegmentReader *)0x0) {
        pWVar17 = pWVar11 + lVar10;
      }
      else {
        pwVar3 = (segment->ptr).ptr;
        pWVar17 = (WirePointer *)(pwVar3 + (segment->ptr).size_);
        if (((long)pwVar3 - (long)pWVar11 >> 3 <= lVar10) &&
           (lVar10 <= (long)pWVar17 - (long)pWVar11 >> 3)) {
          pWVar17 = pWVar11 + lVar10;
        }
      }
      pWVar11 = ref;
      if ((uVar6 & 3) != 2 || segment == (SegmentReader *)0x0) goto LAB_001d0d66;
      iVar5 = (*segment->arena->_vptr_Arena[2])();
      segment = (SegmentReader *)CONCAT44(extraout_var,iVar5);
      if (segment == (SegmentReader *)0x0) {
        totalSize();
LAB_001d0f3b:
        pWVar11 = ref;
        pWVar17 = (WirePointer *)0x0;
      }
      else {
        uVar6 = (ref->offsetAndKind).value;
        uVar12 = (ulong)(uVar6 >> 3);
        uVar15 = (segment->ptr).size_;
        if ((long)uVar15 < (long)uVar12) {
          uVar12 = uVar15;
        }
        uVar16 = 2 - (ulong)((uVar6 & 4) == 0);
        if (uVar15 < uVar12 + uVar16) {
LAB_001d0f36:
          totalSize();
          goto LAB_001d0f3b;
        }
        pWVar11 = (WirePointer *)((segment->ptr).ptr + uVar12);
        uVar15 = segment->readLimiter->limit;
        if (uVar15 < uVar16) {
          (*segment->arena->_vptr_Arena[3])();
          goto LAB_001d0f36;
        }
        segment->readLimiter->limit = uVar15 - uVar16;
        pWVar1 = pWVar11 + 1;
        if (((ref->offsetAndKind).value & 4) == 0) {
          lVar10 = (long)((int)*(uint64_t *)&(pWVar11->offsetAndKind).value >> 2);
          pwVar3 = (segment->ptr).ptr;
          pWVar17 = (WirePointer *)(pwVar3 + (segment->ptr).size_);
          if (((long)pwVar3 - (long)pWVar1 >> 3 <= lVar10) &&
             (lVar10 <= (long)pWVar17 - (long)pWVar1 >> 3)) {
            pWVar17 = pWVar1 + lVar10;
          }
        }
        else {
          iVar5 = (*segment->arena->_vptr_Arena[2])
                            (segment->arena,(ulong)(pWVar11->field_1).upper32Bits);
          pSVar7 = (SegmentReader *)CONCAT44(extraout_var_00,iVar5);
          if (pSVar7 == (SegmentReader *)0x0) {
            totalSize();
          }
          else {
            uVar6 = (uint)*(uint64_t *)&(pWVar11->offsetAndKind).value;
            if ((uVar6 & 3) == 2) {
              uVar15 = (ulong)(uVar6 >> 3);
              sVar4 = (pSVar7->ptr).size_;
              if ((long)sVar4 < (long)uVar15) {
                uVar15 = sVar4;
              }
              segment = pSVar7;
              pWVar11 = pWVar1;
              pWVar17 = (WirePointer *)((pSVar7->ptr).ptr + uVar15);
              goto LAB_001d0d66;
            }
            totalSize();
          }
          pWVar11 = pWVar1;
          pWVar17 = (WirePointer *)0x0;
        }
      }
LAB_001d0d66:
      uVar15 = 0;
      if (pWVar17 != (WirePointer *)0x0) {
        iVar5 = nestingLimit + -1;
        uVar6 = (uint)*(uint64_t *)&(pWVar11->offsetAndKind).value;
        switch(uVar6 & 3) {
        case 0:
          if (segment == (SegmentReader *)0x0) {
LAB_001d0ddb:
            uVar16 = (ulong)(pWVar11->field_1).structRef.dataSize.value;
            uVar14 = (ulong)(pWVar11->field_1).structRef.ptrCount.value;
            uVar12 = uVar16 + uVar14;
            uVar15 = 0;
            if (uVar14 != 0) {
              pWVar17 = pWVar17 + uVar16;
              uVar15 = 0;
              do {
                MVar18 = totalSize(segment,pWVar17,iVar5);
                uVar12 = uVar12 + MVar18.wordCount;
                uVar15 = (ulong)((int)uVar15 + MVar18.capCount);
                pWVar17 = pWVar17 + 1;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            goto LAB_001d10ab;
          }
          uVar15 = (ulong)(pWVar11->field_1).structRef.dataSize.value +
                   (ulong)(pWVar11->field_1).structRef.ptrCount.value;
          if (((long)pWVar17 - (long)(segment->ptr).ptr >> 3) + uVar15 <= (segment->ptr).size_) {
            uVar12 = segment->readLimiter->limit;
            if (uVar15 <= uVar12) {
              segment->readLimiter->limit = uVar12 - uVar15;
              goto LAB_001d0ddb;
            }
            (*segment->arena->_vptr_Arena[3])();
          }
          totalSize();
          break;
        case 1:
          uVar6 = (pWVar11->field_1).upper32Bits;
          uVar12 = (ulong)(uVar6 & 7);
          switch(uVar6 & 7) {
          case 0:
            uVar15 = uVar12;
            goto LAB_001d10ab;
          default:
            uVar12 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + uVar12 * 4) * (ulong)(uVar6 >> 3) +
                     0x3f >> 6;
            if (segment == (SegmentReader *)0x0) goto LAB_001d10ab;
            uVar16 = uVar12 & 0xffffffff;
            if (((long)pWVar17 - (long)(segment->ptr).ptr >> 3) + uVar16 <= (segment->ptr).size_) {
              uVar14 = segment->readLimiter->limit;
              if (uVar16 <= uVar14) {
                segment->readLimiter->limit = uVar14 - uVar16;
                goto LAB_001d10ab;
              }
              (*segment->arena->_vptr_Arena[3])();
            }
            totalSize();
            break;
          case 6:
            uVar12 = (ulong)(uVar6 >> 3);
            if (segment == (SegmentReader *)0x0) {
LAB_001d1073:
              uVar12 = (ulong)(uVar6 >> 3);
              if (7 < uVar6) {
                uVar15 = 0;
                uVar16 = uVar12;
                do {
                  MVar18 = totalSize(segment,pWVar17,iVar5);
                  uVar12 = uVar12 + MVar18.wordCount;
                  uVar15 = (ulong)((int)uVar15 + MVar18.capCount);
                  pWVar17 = pWVar17 + 1;
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
              goto LAB_001d10ab;
            }
            if (((long)pWVar17 - (long)(segment->ptr).ptr >> 3) + uVar12 <= (segment->ptr).size_) {
              uVar16 = segment->readLimiter->limit;
              if (uVar12 <= uVar16) {
                segment->readLimiter->limit = uVar16 - uVar12;
                goto LAB_001d1073;
              }
              (*segment->arena->_vptr_Arena[3])();
            }
            totalSize();
            break;
          case 7:
            uVar16 = (ulong)(uVar6 >> 3);
            if (segment == (SegmentReader *)0x0) {
LAB_001d0f90:
              uVar6 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
              if ((uVar6 & 3) == 0) {
                uVar6 = uVar6 >> 2 & 0x1fffffff;
                uVar2 = *(ushort *)&pWVar17->field_1;
                uVar12 = ((ulong)(pWVar17->field_1).structRef.ptrCount.value + (ulong)uVar2) *
                         (ulong)uVar6;
                if (uVar12 < uVar16 || uVar12 - uVar16 == 0) {
                  uVar12 = uVar12 + 1;
                  uVar8 = (uint)(pWVar17->field_1).structRef.ptrCount.value;
                  if ((uVar8 != 0) && (uVar6 != 0)) {
                    uVar15 = 0;
                    uVar9 = 0;
                    do {
                      pWVar17 = pWVar17 + uVar2;
                      uVar13 = uVar8;
                      do {
                        pWVar17 = pWVar17 + 1;
                        MVar18 = totalSize(segment,pWVar17,iVar5);
                        uVar12 = uVar12 + MVar18.wordCount;
                        uVar15 = (ulong)((int)uVar15 + MVar18.capCount);
                        uVar13 = uVar13 - 1;
                      } while (uVar13 != 0);
                      uVar9 = uVar9 + 1;
                    } while (uVar9 != uVar6);
                  }
                  goto LAB_001d10ab;
                }
                totalSize();
              }
              else {
                totalSize();
              }
            }
            else {
              if (((long)pWVar17 - (long)(segment->ptr).ptr >> 3) + uVar16 + 1 <=
                  (segment->ptr).size_) {
                uVar12 = segment->readLimiter->limit;
                if (uVar16 + 1 <= uVar12) {
                  segment->readLimiter->limit = uVar12 - (uVar16 + 1);
                  goto LAB_001d0f90;
                }
                (*segment->arena->_vptr_Arena[3])();
              }
              totalSize();
            }
          }
          break;
        case 2:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x36f,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                     (char (*) [24])"Unexpected FAR pointer.");
          kj::_::Debug::Fault::~Fault(&local_38);
          break;
        case 3:
          uVar12 = 0;
          if (uVar6 == 3) {
            uVar15 = 1;
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                      (&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x377,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                       (char (*) [22])"Unknown pointer type.");
            kj::_::Debug::Fault::~Fault(&local_38);
            uVar15 = 0;
          }
          goto LAB_001d10ab;
        }
      }
    }
  }
  uVar12 = 0;
  uVar15 = 0;
LAB_001d10ab:
  MVar18._8_8_ = uVar15;
  MVar18.wordCount = uVar12;
  return MVar18;
}

Assistant:

static MessageSizeCounts totalSize(
      SegmentReader* segment, const WirePointer* ref, int nestingLimit) {
    // Compute the total size of the object pointed to, not counting far pointer overhead.

    MessageSizeCounts result = { ZERO * WORDS, 0 };

    if (ref->isNull()) {
      return result;
    }

    KJ_REQUIRE(nestingLimit > 0, "Message is too deeply-nested.") {
      return result;
    }
    --nestingLimit;

    const word* ptr;
    KJ_IF_MAYBE(p, followFars(ref, ref->target(segment), segment)) {
      ptr = p;
    } else {
      return result;
    }

    switch (ref->kind()) {
      case WirePointer::STRUCT: {
        KJ_REQUIRE(boundsCheck(segment, ptr, ref->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer.") {
          return result;
        }
        result.addWords(ref->structRef.wordSize());

        const WirePointer* pointerSection =
            reinterpret_cast<const WirePointer*>(ptr + ref->structRef.dataSize.get());
        for (auto i: kj::zeroTo(ref->structRef.ptrCount.get())) {
          result += totalSize(segment, pointerSection + i, nestingLimit);
        }
        break;
      }
      case WirePointer::LIST: {
        switch (ref->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto totalWords = roundBitsUpToWords(
                upgradeBound<uint64_t>(ref->listRef.elementCount()) *
                dataBitsPerElement(ref->listRef.elementSize()));
            KJ_REQUIRE(boundsCheck(segment, ptr, totalWords),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }
            result.addWords(totalWords);
            break;
          }
          case ElementSize::POINTER: {
            auto count = ref->listRef.elementCount() * (POINTERS / ELEMENTS);

            KJ_REQUIRE(boundsCheck(segment, ptr, count * WORDS_PER_POINTER),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }

            result.addWords(count * WORDS_PER_POINTER);

            for (auto i: kj::zeroTo(count)) {
              result += totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                  nestingLimit);
            }
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            auto wordCount = ref->listRef.inlineCompositeWordCount();
            KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }

            const WirePointer* elementTag = reinterpret_cast<const WirePointer*>(ptr);
            auto count = elementTag->inlineCompositeListElementCount();

            KJ_REQUIRE(elementTag->kind() == WirePointer::STRUCT,
                       "Don't know how to handle non-STRUCT inline composite.") {
              return result;
            }

            auto actualSize = elementTag->structRef.wordSize() / ELEMENTS *
                              upgradeBound<uint64_t>(count);
            KJ_REQUIRE(actualSize <= wordCount,
                       "Struct list pointer's elements overran size.") {
              return result;
            }

            // We count the actual size rather than the claimed word count because that's what
            // we'll end up with if we make a copy.
            result.addWords(actualSize + POINTER_SIZE_IN_WORDS);

            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            if (pointerCount > ZERO * POINTERS) {
              const word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  result += totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                      nestingLimit);
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        if (ref->isCapability()) {
          result.capCount++;
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }

    return result;
  }